

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<HashWriter,bool,std::allocator<bool>>
               (HashWriter *os,vector<bool,_std::allocator<bool>_> *v)

{
  long lVar1;
  bool bVar2;
  _Bit_iterator_base *in_RDI;
  long in_FS_OFFSET;
  bool elem;
  vector<bool,_std::allocator<bool>_> *__range3;
  const_iterator __end0;
  const_iterator __begin0;
  HashWriter *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<bool,_std::allocator<bool>_>::size
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  WriteCompactSize<HashWriter>
            ((HashWriter *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             (uint64_t)in_RDI);
  std::vector<bool,_std::allocator<bool>_>::begin
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::vector<bool,_std::allocator<bool>_>::end
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  while( true ) {
    bVar2 = std::operator==((_Bit_iterator_base *)
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff9f =
         std::_Bit_const_iterator::operator*
                   ((_Bit_const_iterator *)
                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    Serialize<HashWriter>(in_stack_ffffffffffffff88,false);
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}